

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall fmt::v11::detail::bigint::subtract_aligned(bigint *this,bigint *other)

{
  uint *puVar1;
  size_t sVar2;
  uint *puVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  
  if (other->exp_ < this->exp_) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O2/_deps/fmt-src/include/fmt/format.h"
                ,0x9ed,"unaligned bigints");
  }
  iVar4 = compare(this,other);
  if (-1 < iVar4) {
    puVar1 = (other->bigits_).super_buffer<unsigned_int>.ptr_;
    sVar2 = (other->bigits_).super_buffer<unsigned_int>.size_;
    lVar6 = (long)(other->exp_ - this->exp_);
    puVar3 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    lVar5 = lVar6 << 0x20;
    uVar7 = 0;
    sVar8 = 0;
    while( true ) {
      if (sVar2 == sVar8) break;
      uVar7 = (ulong)puVar3[lVar6 + sVar8] - (uVar7 + puVar1[sVar8]);
      puVar3[lVar6 + sVar8] = (uint)uVar7;
      uVar7 = uVar7 >> 0x3f;
      sVar8 = sVar8 + 1;
      lVar5 = lVar5 + 0x100000000;
    }
    if (((int)uVar7 != 0) &&
       (puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_,
       lVar6 = *(uint *)((long)puVar1 + (lVar5 >> 0x1e)) - uVar7,
       *(int *)((long)puVar1 + (lVar5 >> 0x1e)) = (int)lVar6, lVar6 < 0)) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O2/_deps/fmt-src/include/fmt/format.h"
                  ,0x9f4,"");
    }
    remove_leading_zeros(this);
    return;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O2/_deps/fmt-src/include/fmt/format.h"
              ,0x9ee,"");
}

Assistant:

FMT_CONSTEXPR void subtract_aligned(const bigint& other) {
    FMT_ASSERT(other.exp_ >= exp_, "unaligned bigints");
    FMT_ASSERT(compare(*this, other) >= 0, "");
    bigit borrow = 0;
    int i = other.exp_ - exp_;
    for (size_t j = 0, n = other.bigits_.size(); j != n; ++i, ++j)
      subtract_bigits(i, other.bigits_[j], borrow);
    if (borrow != 0) subtract_bigits(i, 0, borrow);
    FMT_ASSERT(borrow == 0, "");
    remove_leading_zeros();
  }